

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_MappingChannel * __thiscall
ON_SimpleArray<ON_MappingChannel>::AppendNew(ON_SimpleArray<ON_MappingChannel> *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0x98) < 0x10000001)) {
      uVar3 = 4;
      if (2 < (int)uVar1) {
        uVar3 = uVar1 * 2;
      }
    }
    else {
      uVar3 = 0x1af28e;
      if ((int)uVar1 < 0x1af28e) {
        uVar3 = uVar1;
      }
      uVar3 = uVar3 + uVar1;
    }
    if ((uint)this->m_capacity < uVar3) {
      SetCapacity(this,(long)(int)uVar3);
    }
  }
  memset(this->m_a + this->m_count,0,0x98);
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}